

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O0

ShaderProgramDeclaration *
deqp::gles2::Functional::generateShaderProgramDeclaration
          (ShaderProgramDeclaration *__return_storage_ptr__,int numUnits,GLenum *unitTypes)

{
  GLenum *in_RCX;
  string local_240;
  FragmentSource local_220;
  allocator<char> local_1f9;
  string local_1f8;
  VertexSource local_1d8;
  Uniform local_1b8;
  Uniform local_190;
  string local_168;
  undefined1 local_148 [8];
  string transformationName;
  undefined1 local_108 [8];
  string samplerName;
  FragmentOutput local_e0;
  int ndx;
  allocator<char> local_d1;
  string local_d0;
  VertexAttribute local_b0;
  allocator<char> local_71;
  string local_70;
  VertexAttribute local_50;
  undefined1 local_21;
  GLenum *local_20;
  GLenum *unitTypes_local;
  ShaderProgramDeclaration *pSStack_10;
  int numUnits_local;
  ShaderProgramDeclaration *decl;
  
  local_21 = 0;
  local_20 = unitTypes;
  unitTypes_local._4_4_ = numUnits;
  pSStack_10 = __return_storage_ptr__;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"a_position",&local_71);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_50,&local_70,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_50);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"a_coord",&local_d1);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_b0,&local_d0,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_b0);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  sglr::pdec::VertexToFragmentVarying::VertexToFragmentVarying
            ((VertexToFragmentVarying *)&ndx,GENERICVECTYPE_FLOAT,0);
  sglr::pdec::ShaderProgramDeclaration::operator<<
            (__return_storage_ptr__,(VertexToFragmentVarying *)&ndx);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_e0,GENERICVECTYPE_FLOAT);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_e0);
  for (samplerName.field_2._12_4_ = 0; (int)samplerName.field_2._12_4_ < (int)unitTypes_local._4_4_;
      samplerName.field_2._12_4_ = samplerName.field_2._12_4_ + 1) {
    de::toString<int>((string *)((long)&transformationName.field_2 + 8),
                      (int *)(samplerName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   "u_sampler",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&transformationName.field_2 + 8));
    std::__cxx11::string::~string((string *)(transformationName.field_2._M_local_buf + 8));
    de::toString<int>(&local_168,(int *)(samplerName.field_2._M_local_buf + 0xc));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "u_trans",&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    in_RCX = (GLenum *)(long)(int)samplerName.field_2._12_4_;
    sglr::pdec::Uniform::Uniform
              (&local_190,(string *)local_108,local_20[(long)in_RCX] == 0xde1 ^ TYPE_SAMPLER_CUBE);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_190);
    sglr::pdec::Uniform::~Uniform(&local_190);
    sglr::pdec::Uniform::Uniform(&local_1b8,(string *)local_148,TYPE_FLOAT_MAT3);
    sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_1b8);
    sglr::pdec::Uniform::~Uniform(&local_1b8);
    std::__cxx11::string::~string((string *)local_148);
    std::__cxx11::string::~string((string *)local_108);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "attribute highp vec4 a_position;\nattribute mediump vec2 a_coord;\nvarying mediump vec2 v_coord;\n\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_coord;\n}\n"
             ,&local_1f9);
  sglr::pdec::VertexSource::VertexSource(&local_1d8,&local_1f8);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_1d8);
  sglr::pdec::VertexSource::~VertexSource(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  generateMultiTexFragmentShader_abi_cxx11_
            (&local_240,(Functional *)(ulong)unitTypes_local._4_4_,(int)local_20,in_RCX);
  sglr::pdec::FragmentSource::FragmentSource(&local_220,&local_240);
  sglr::pdec::ShaderProgramDeclaration::operator<<(__return_storage_ptr__,&local_220);
  sglr::pdec::FragmentSource::~FragmentSource(&local_220);
  std::__cxx11::string::~string((string *)&local_240);
  return __return_storage_ptr__;
}

Assistant:

static sglr::pdec::ShaderProgramDeclaration generateShaderProgramDeclaration (int numUnits, const GLenum* unitTypes)
{
	sglr::pdec::ShaderProgramDeclaration decl;

	decl << sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::VertexAttribute("a_coord", rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::VertexToFragmentVarying(rr::GENERICVECTYPE_FLOAT);
	decl << sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT);

	for (int ndx = 0; ndx < numUnits; ++ndx)
	{
		string	samplerName			= "u_sampler" + de::toString(ndx);
		string	transformationName	= "u_trans" + de::toString(ndx);

		decl << sglr::pdec::Uniform(samplerName, (unitTypes[ndx] == GL_TEXTURE_2D) ? (glu::TYPE_SAMPLER_2D) : (glu::TYPE_SAMPLER_CUBE));
		decl << sglr::pdec::Uniform(transformationName, glu::TYPE_FLOAT_MAT3);
	}

	decl << sglr::pdec::VertexSource("attribute highp vec4 a_position;\n"
									 "attribute mediump vec2 a_coord;\n"
									 "varying mediump vec2 v_coord;\n"
									 "\n"
									 "void main (void)\n"
									 "{\n"
									 "	gl_Position = a_position;\n"
									 "	v_coord = a_coord;\n"
									 "}\n");
	decl << sglr::pdec::FragmentSource(generateMultiTexFragmentShader(numUnits, unitTypes));

	return decl;
}